

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

handle * __thiscall pybind11::handle::inc_ref(handle *this)

{
  int iVar1;
  allocator<char> local_31;
  string local_30;
  handle *local_10;
  handle *this_local;
  
  local_10 = this;
  inc_ref_counter(1);
  if (this->m_ptr != (PyObject *)0x0) {
    iVar1 = PyGILState_Check();
    if (iVar1 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"pybind11::handle::inc_ref()",&local_31);
      throw_gilstate_error(this,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::allocator<char>::~allocator(&local_31);
    }
  }
  _Py_XINCREF(this->m_ptr);
  return this;
}

Assistant:

const handle &inc_ref() const & {
#ifdef PYBIND11_HANDLE_REF_DEBUG
        inc_ref_counter(1);
#endif
#ifdef PYBIND11_ASSERT_GIL_HELD_INCREF_DECREF
        if (m_ptr != nullptr && !PyGILState_Check()) {
            throw_gilstate_error("pybind11::handle::inc_ref()");
        }
#endif
        Py_XINCREF(m_ptr);
        return *this;
    }